

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O0

string * __thiscall miniros::Connection::getRemoteString_abi_cxx11_(Connection *this)

{
  ostream *poVar1;
  element_type *peVar2;
  string *in_RDI;
  stringstream ss;
  string local_1e8 [32];
  string local_1c8 [48];
  Connection *in_stack_fffffffffffffe68;
  ostream local_188 [392];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&stack0xfffffffffffffe68);
  poVar1 = std::operator<<(local_188,"callerid=[");
  getCallerId_abi_cxx11_(in_stack_fffffffffffffe68);
  poVar1 = std::operator<<(poVar1,local_1c8);
  poVar1 = std::operator<<(poVar1,"] address=[");
  peVar2 = std::__shared_ptr_access<miniros::Transport,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<miniros::Transport,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x42e8d6);
  (*peVar2->_vptr_Transport[10])(local_1e8);
  poVar1 = std::operator<<(poVar1,local_1e8);
  std::operator<<(poVar1,"]");
  std::__cxx11::string::~string(local_1e8);
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&stack0xfffffffffffffe68);
  return in_RDI;
}

Assistant:

std::string Connection::getRemoteString()
{
  std::stringstream ss;
  ss << "callerid=[" << getCallerId() << "] address=[" << transport_->getTransportInfo() << "]";
  return ss.str();
}